

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogComboBox::showPopup(QFileDialogComboBox *this)

{
  undefined8 uVar1;
  QLatin1StringView latin1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QAbstractItemModel *pQVar6;
  ulong uVar7;
  QAbstractItemModel *pQVar8;
  qsizetype qVar9;
  QAbstractItemModel *this_00;
  QUrlModel *this_01;
  QStandardItemModel *pQVar10;
  QFlags_conflict1 *pQVar11;
  long in_RDI;
  long in_FS_OFFSET;
  QStandardItemModel *m;
  int i;
  ItemFlags flags;
  QUrl path;
  QList<QUrl> urls;
  QUrl url;
  QModelIndex idx;
  QList<QUrl> list;
  int iVar12;
  rvalue_ref in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  char *in_stack_fffffffffffffd48;
  QFileDialogPrivate *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  QComboBox *in_stack_fffffffffffffd60;
  QUrlModel *in_stack_fffffffffffffd68;
  undefined1 uVar13;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  QUrlModel *in_stack_fffffffffffffd78;
  int local_234;
  QFlagsStorage<Qt::ItemFlag> local_214;
  undefined1 local_210 [24];
  undefined1 local_1f8 [24];
  undefined1 local_1e0 [16];
  QComboBox *in_stack_fffffffffffffe30;
  undefined1 *local_1c8;
  quintptr local_1c0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_1b8;
  undefined1 local_198 [24];
  QUrl local_180;
  QList<QUrl> local_178;
  undefined1 local_160 [24];
  undefined1 local_148 [24];
  undefined1 *local_130;
  quintptr local_128;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_120;
  undefined1 local_118 [24];
  QUrl local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  QAbstractItemModel *local_e8;
  QUrl local_c8 [2];
  int in_stack_ffffffffffffff4c;
  QModelIndex local_a8;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 local_78 [48];
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = QComboBox::model(in_stack_fffffffffffffd60);
  QModelIndex::QModelIndex((QModelIndex *)0x7623bb);
  iVar3 = (**(code **)(*(long *)pQVar6 + 0x78))();
  if (1 < iVar3) {
    QComboBox::showPopup(in_stack_fffffffffffffe30);
  }
  memset(local_78,0,0x18);
  QList<QUrl>::QList((QList<QUrl> *)0x76240f);
  QUrlModel::setUrls(in_stack_fffffffffffffd68,(QList<QUrl> *)in_stack_fffffffffffffd60);
  QList<QUrl>::~QList((QList<QUrl> *)0x76242e);
  local_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QUrl>::QList((QList<QUrl> *)0x762468);
  local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  uVar1 = *(undefined8 *)(*(long *)(in_RDI + 0x30) + 0x300);
  QFileDialogPrivate::rootPath(in_stack_fffffffffffffd50);
  QFileSystemModel::index((QString *)&local_a8,(int)uVar1);
  QString::~QString((QString *)0x7624e4);
  while( true ) {
    bVar2 = QModelIndex::isValid
                      ((QModelIndex *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40))
    ;
    uVar13 = (undefined1)((ulong)in_stack_fffffffffffffd68 >> 0x38);
    if (!bVar2) break;
    local_c8[0].d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::data((QModelIndex *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                      (int)((ulong)in_stack_fffffffffffffd50 >> 0x20));
    ::QVariant::toString();
    QUrl::fromLocalFile((QString *)local_c8);
    QString::~QString((QString *)0x76255a);
    ::QVariant::~QVariant(&local_28);
    uVar7 = QUrl::isValid();
    if ((uVar7 & 1) != 0) {
      QList<QUrl>::append((QList<QUrl> *)
                          CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                          in_stack_fffffffffffffd38);
    }
    QModelIndex::parent((QModelIndex *)in_stack_fffffffffffffd50);
    local_a8._0_8_ = local_f8;
    local_a8.i = (quintptr)local_f0;
    local_a8.m.ptr = local_e8;
    QUrl::~QUrl(local_c8);
  }
  Qt::Literals::StringLiterals::operator____L1
            (in_stack_fffffffffffffd48,CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40)
            );
  latin1.m_size._4_4_ = in_stack_fffffffffffffd74;
  latin1.m_size._0_4_ = in_stack_fffffffffffffd70;
  latin1.m_data = (char *)in_stack_fffffffffffffd78;
  QString::QString((QString *)in_stack_fffffffffffffd50,latin1);
  QUrl::QUrl(&local_100,(QString *)local_118,TolerantMode);
  QList<QUrl>::append((QList<QUrl> *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                      in_stack_fffffffffffffd38);
  QUrl::~QUrl(&local_100);
  QString::~QString((QString *)0x76266a);
  QUrlModel::addUrls(in_stack_fffffffffffffd78,
                     (QList<QUrl> *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                     in_stack_ffffffffffffff4c,(bool)uVar13);
  pQVar6 = QComboBox::model(in_stack_fffffffffffffd60);
  pQVar8 = QComboBox::model(in_stack_fffffffffffffd60);
  QModelIndex::QModelIndex((QModelIndex *)0x7626b2);
  iVar3 = (**(code **)(*(long *)pQVar8 + 0x78))(pQVar8,local_148);
  QModelIndex::QModelIndex((QModelIndex *)0x7626d9);
  (**(code **)(*(long *)pQVar6 + 0x60))(&local_130,pQVar6,iVar3 + -1,0,local_160);
  local_a8._0_8_ = local_130;
  local_a8.i = local_128;
  local_a8.m.ptr = local_120.ptr;
  local_178.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_178.d.ptr = (QUrl *)&DAT_aaaaaaaaaaaaaaaa;
  local_178.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QUrl>::QList((QList<QUrl> *)0x762764);
  local_234 = 0;
  while( true ) {
    qVar9 = QList<QString>::size((QList<QString> *)(in_RDI + 0x38));
    iVar3 = (int)((ulong)in_stack_fffffffffffffd50 >> 0x20);
    if (qVar9 <= local_234) break;
    local_180.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QList<QString>::at((QList<QString> *)
                       CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                       (qsizetype)in_stack_fffffffffffffd38);
    QUrl::fromLocalFile((QString *)&local_180);
    bVar2 = QListSpecialMethodsBase<QUrl>::contains<QUrl>
                      ((QListSpecialMethodsBase<QUrl> *)
                       CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                       in_stack_fffffffffffffd38);
    if (!bVar2) {
      QList<QUrl>::prepend
                ((QList<QUrl> *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                 in_stack_fffffffffffffd38);
    }
    QUrl::~QUrl(&local_180);
    local_234 = local_234 + 1;
  }
  qVar9 = QList<QUrl>::size(&local_178);
  iVar5 = (int)((ulong)in_stack_fffffffffffffd38 >> 0x20);
  if (0 < qVar9) {
    pQVar6 = QComboBox::model(in_stack_fffffffffffffd60);
    iVar3 = (int)((ulong)pQVar6 >> 0x20);
    pQVar6 = QComboBox::model(in_stack_fffffffffffffd60);
    QModelIndex::QModelIndex((QModelIndex *)0x762863);
    in_stack_fffffffffffffd5c = (**(code **)(*(long *)pQVar6 + 0x78))(pQVar6,local_198);
    QModelIndex::QModelIndex((QModelIndex *)0x762887);
    QAbstractItemModel::insertRow
              ((QAbstractItemModel *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
               iVar5,(QModelIndex *)0x76289d);
    pQVar8 = QComboBox::model(in_stack_fffffffffffffd60);
    this_00 = QComboBox::model(in_stack_fffffffffffffd60);
    QModelIndex::QModelIndex((QModelIndex *)0x7628c8);
    iVar4 = (**(code **)(*(long *)this_00 + 0x78))(this_00,local_1e0);
    iVar4 = iVar4 + -1;
    QModelIndex::QModelIndex((QModelIndex *)0x7628ef);
    (**(code **)(*(long *)pQVar8 + 0x60))(&local_1c8,pQVar8,iVar4,0,local_1f8);
    uVar13 = (undefined1)((ulong)pQVar8 >> 0x38);
    local_a8._0_8_ = local_1c8;
    local_a8.i = local_1c0;
    local_a8.m.ptr = local_1b8.ptr;
    this_01 = (QUrlModel *)QComboBox::model((QComboBox *)this_00);
    QFileDialog::tr((char *)pQVar6,
                    (char *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),iVar5);
    ::QVariant::QVariant(&local_48,(QString *)local_210);
    (**(code **)(*(long *)this_01 + 0x98))(this_01,&local_a8,&local_48,2);
    ::QVariant::~QVariant(&local_48);
    QString::~QString((QString *)0x7629be);
    QComboBox::model((QComboBox *)this_00);
    pQVar10 = qobject_cast<QStandardItemModel*>((QObject *)0x7629d0);
    if (pQVar10 != (QStandardItemModel *)0x0) {
      local_214.i = 0xaaaaaaaa;
      local_214.i = (**(code **)(*(long *)pQVar10 + 0x138))(pQVar10,&local_a8);
      QFlags<Qt::ItemFlag>::operator&=((QFlags<Qt::ItemFlag> *)&local_214,-0x21);
      iVar5 = QModelIndex::row(&local_a8);
      iVar12 = (int)pQVar10;
      QModelIndex::column(&local_a8);
      pQVar11 = (QFlags_conflict1 *)QStandardItemModel::item(iVar12,iVar5);
      QStandardItem::setFlags(pQVar11);
    }
    QUrlModel::addUrls(this_01,(QList<QUrl> *)CONCAT44(iVar4,in_stack_fffffffffffffd70),
                       in_stack_ffffffffffffff4c,(bool)uVar13);
  }
  QComboBox::setCurrentIndex
            ((QComboBox *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),iVar3);
  QComboBox::showPopup(in_stack_fffffffffffffe30);
  QList<QUrl>::~QList((QList<QUrl> *)0x762abc);
  QList<QUrl>::~QList((QList<QUrl> *)0x762ac9);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialogComboBox::showPopup()
{
    if (model()->rowCount() > 1)
        QComboBox::showPopup();

    urlModel->setUrls(QList<QUrl>());
    QList<QUrl> list;
    QModelIndex idx = d_ptr->model->index(d_ptr->rootPath());
    while (idx.isValid()) {
        QUrl url = QUrl::fromLocalFile(idx.data(QFileSystemModel::FilePathRole).toString());
        if (url.isValid())
            list.append(url);
        idx = idx.parent();
    }
    // add "my computer"
    list.append(QUrl("file:"_L1));
    urlModel->addUrls(list, 0);
    idx = model()->index(model()->rowCount() - 1, 0);

    // append history
    QList<QUrl> urls;
    for (int i = 0; i < m_history.size(); ++i) {
        QUrl path = QUrl::fromLocalFile(m_history.at(i));
        if (!urls.contains(path))
            urls.prepend(path);
    }
    if (urls.size() > 0) {
        model()->insertRow(model()->rowCount());
        idx = model()->index(model()->rowCount()-1, 0);
        // ### TODO maybe add a horizontal line before this
        model()->setData(idx, QFileDialog::tr("Recent Places"));
        QStandardItemModel *m = qobject_cast<QStandardItemModel*>(model());
        if (m) {
            Qt::ItemFlags flags = m->flags(idx);
            flags &= ~Qt::ItemIsEnabled;
            m->item(idx.row(), idx.column())->setFlags(flags);
        }
        urlModel->addUrls(urls, -1, false);
    }
    setCurrentIndex(0);

    QComboBox::showPopup();
}